

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Func * __thiscall wabt::Module::GetFunc(Module *this,Var *var)

{
  pointer ppFVar1;
  Index IVar2;
  Func *pFVar3;
  
  IVar2 = BindingHash::FindIndex(&this->func_bindings,var);
  ppFVar1 = (this->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3)) {
    pFVar3 = ppFVar1[IVar2];
  }
  else {
    pFVar3 = (Func *)0x0;
  }
  return pFVar3;
}

Assistant:

const Func* Module::GetFunc(const Var& var) const {
  return const_cast<Module*>(this)->GetFunc(var);
}